

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O1

bool __thiscall
EthBasePort::ReadQuadletNode
          (EthBasePort *this,nodeid_t node,nodeaddr_t addr,quadlet_t *data,uchar flags)

{
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  quadlet_t *qp;
  ostream *poVar6;
  long lVar7;
  byte bVar8;
  uchar *puVar9;
  ulong uVar10;
  undefined6 in_register_00000032;
  EthBasePort *this_00;
  long *local_50 [2];
  long local_40 [2];
  
  uVar10 = CONCAT62(in_register_00000032,node) & 0xffffffff;
  if ((int)CONCAT62(in_register_00000032,node) == 0x3f) {
    bVar8 = 0;
  }
  else {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"ReadQuadlet","");
    iVar4 = (*(this->super_BasePort)._vptr_BasePort[0x1b])(this,(string *)local_50,0);
    bVar8 = (byte)iVar4 ^ 1;
  }
  if (((short)uVar10 != 0x3f) && (local_50[0] != local_40)) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (bVar8 == 0) {
    iVar4 = (*(this->super_BasePort)._vptr_BasePort[0x2f])(this);
    if (0 < iVar4) {
      poVar6 = (this->super_BasePort).outStr;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"ReadQuadlet: flushed ",0x15);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," packets",8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    this->fw_tl = this->fw_tl + 1 & 0x3f;
    BasePort::SetGenericBuffer(&this->super_BasePort);
    puVar9 = (this->super_BasePort).GenericBuffer;
    uVar5 = (*(this->super_BasePort)._vptr_BasePort[0x17])(this);
    puVar9 = puVar9 + uVar5;
    iVar4 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,1);
    uVar2 = (ulong)node;
    (*(this->super_BasePort)._vptr_BasePort[0x31])(this,puVar9,(ulong)(iVar4 + 0x10U),uVar2,flags);
    uVar5 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,0);
    puVar9[uVar5] = '\0';
    if (((flags & 0x40) != 0) || (this->useFwBridge == false)) {
      puVar9[uVar5] = '\x01';
    }
    puVar9[uVar5 + 1] = (uchar)(this->super_BasePort).FwBusGeneration;
    this_00 = this;
    uVar5 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,1);
    make_qread_packet(this_00,(quadlet_t *)(puVar9 + uVar5),node,addr,(uint)this->fw_tl);
    iVar4 = (*(this->super_BasePort)._vptr_BasePort[0x2d])
                      (this,uVar2,puVar9,(ulong)(iVar4 + 0x10U),(ulong)(flags >> 7));
    if ((char)iVar4 != '\0') {
      if ((this->eth_read_callback == (EthCallbackType)0x0) ||
         (bVar3 = (*this->eth_read_callback)(this,(uchar)uVar10,(this->super_BasePort).outStr),
         bVar3)) {
        puVar9 = (this->super_BasePort).GenericBuffer;
        uVar5 = (*(this->super_BasePort)._vptr_BasePort[0x18])(this);
        puVar9 = puVar9 + uVar5;
        iVar4 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,3);
        uVar5 = (*(this->super_BasePort)._vptr_BasePort[0x2e])(this,puVar9,(ulong)(iVar4 + 0x1cU));
        if (uVar5 == iVar4 + 0x1cU) {
          uVar5 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,3);
          ProcessExtraData(this,puVar9 + (ulong)uVar5 + 0x14);
          iVar4 = (*(this->super_BasePort)._vptr_BasePort[0x32])(this,puVar9,(ulong)(flags >> 7));
          if ((char)iVar4 == '\0') {
            return false;
          }
          uVar5 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,3);
          lVar7 = 0;
          do {
            uVar1 = *(uint *)(puVar9 + lVar7 * 4 + (ulong)uVar5);
            *(uint *)(puVar9 + lVar7 * 4 + (ulong)uVar5) =
                 uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 5);
          uVar5 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,3);
          bVar3 = CheckFirewirePacket(this,puVar9 + uVar5,0,node,6,(uint)this->fw_tl);
          if (bVar3) {
            uVar5 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,3);
            *data = *(quadlet_t *)(puVar9 + (ulong)uVar5 + 0xc);
            return true;
          }
          return false;
        }
        if (0xf < (this->super_BasePort).Node2Board[uVar2]) {
          return false;
        }
        poVar6 = (this->super_BasePort).outStr;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"ReadQuadlet: failed to receive read response from board ",0x38);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," via UDP: return value = ",0x19);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,uVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", expected = ",0xd);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        lVar7 = *(long *)poVar6;
      }
      else {
        poVar6 = (this->super_BasePort).outStr;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"ReadQuadlet: callback aborting (not reading packet)",0x33);
        lVar7 = *(long *)poVar6;
      }
      std::ios::widen((char)*(undefined8 *)(lVar7 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
  }
  return false;
}

Assistant:

bool EthBasePort::ReadQuadletNode(nodeid_t node, nodeaddr_t addr, quadlet_t &data, unsigned char flags)
{
    if ((node != FW_NODE_BROADCAST) && !CheckFwBusGeneration("ReadQuadlet"))
        return false;

    // Flush before reading
    int numFlushed = PacketFlushAll();
    if (numFlushed > 0)
        outStr << "ReadQuadlet: flushed " << numFlushed << " packets" << std::endl;

    // Increment transaction label
    fw_tl = (fw_tl+1)&FW_TL_MASK;

    SetGenericBuffer();   // Make sure buffer is allocated

    unsigned char *sendPacket = GenericBuffer+GetWriteQuadAlign();
    unsigned int sendPacketSize = GetPrefixOffset(WR_FW_HEADER)+FW_QREAD_SIZE;

    // Make Ethernet header (only needed for raw Ethernet)
    make_ethernet_header(sendPacket, sendPacketSize, node, flags);

    // Make control word
    make_write_header(sendPacket, sendPacketSize, flags);

    // Build FireWire packet
    make_qread_packet(reinterpret_cast<quadlet_t *>(sendPacket+GetPrefixOffset(WR_FW_HEADER)), node, addr, fw_tl);
    if (!PacketSend(node, sendPacket, sendPacketSize, flags&FW_NODE_ETH_BROADCAST_MASK))
        return false;

    // Invoke callback (if defined) between sending read request
    // and checking for read response. If callback returns false, we
    // skip checking for a received packet.
    if (eth_read_callback && !(*eth_read_callback)(*this, node, outStr)) {
        outStr << "ReadQuadlet: callback aborting (not reading packet)" << std::endl;
        return false;
    }

    unsigned char *recvPacket = GenericBuffer+GetReadQuadAlign();
    unsigned int recvPacketSize = GetPrefixOffset(RD_FW_HEADER)+FW_QRESPONSE_SIZE+FW_EXTRA_SIZE;
    int nRecv = PacketReceive(recvPacket, recvPacketSize);
    if (nRecv != static_cast<int>(recvPacketSize)) {
        // Only print message if Node2Board contains valid board number, to avoid unnecessary error messages during ScanNodes.
        unsigned int boardId = Node2Board[node];
        if (boardId < BoardIO::MAX_BOARDS) {
            outStr << "ReadQuadlet: failed to receive read response from board " << boardId
                   << " via UDP: return value = " << nRecv
                   << ", expected = " << recvPacketSize << std::endl;
        }
        return false;
    }

    ProcessExtraData(recvPacket+GetPrefixOffset(RD_FW_HEADER)+FW_QRESPONSE_SIZE);

    if (!CheckEthernetHeader(recvPacket, flags&FW_NODE_ETH_BROADCAST_MASK))
        return false;
    // Byteswap Firewire header (also swaps quadlet data)
    ByteswapQuadlets(recvPacket + GetPrefixOffset(RD_FW_HEADER), FW_QRESPONSE_SIZE);
    if (!CheckFirewirePacket(recvPacket+GetPrefixOffset(RD_FW_HEADER), 0, node, EthBasePort::QRESPONSE, fw_tl))
        return false;

    const quadlet_t *packet_FW = reinterpret_cast<const quadlet_t *>(recvPacket+GetPrefixOffset(RD_FW_HEADER));
    data = packet_FW[3];
    return true;
}